

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O3

bool __thiscall lzham::symbol_codec::encode_bits(symbol_codec *this,uint bits,uint num_bits)

{
  bool bVar1;
  
  if (num_bits == 0) {
    return true;
  }
  if (0x10 < num_bits) {
    bVar1 = record_put_bits(this,bits >> 0x10,num_bits - 0x10);
    if (!bVar1) {
      return false;
    }
    bits = bits & 0xffff;
    num_bits = 0x10;
  }
  bVar1 = record_put_bits(this,bits,num_bits);
  if (!bVar1) {
    return false;
  }
  return true;
}

Assistant:

bool symbol_codec::encode_bits(uint bits, uint num_bits)
   {
      LZHAM_ASSERT(m_mode == cEncoding);

      if (!num_bits)
         return true;

      LZHAM_ASSERT((num_bits == 32) || (bits <= ((1U << num_bits) - 1)));

      if (num_bits > 16)
      {
         if (!record_put_bits(bits >> 16, num_bits - 16))
            return false;
         if (!record_put_bits(bits & 0xFFFF, 16))
            return false;
      }
      else
      {
         if (!record_put_bits(bits, num_bits))
            return false;
      }
      return true;
   }